

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandReadBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Abc_Ntk_t *pNew;
  Abc_Ntk_t *p;
  char *pcVar5;
  uint fCheck;
  char *pcVar6;
  
  Extra_UtilGetoptReset();
  fCheck = 1;
  bVar3 = true;
  bVar2 = false;
  bVar1 = false;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"nmach"), iVar4 == 0x6d) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x61) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (iVar4 == 99) {
      fCheck = fCheck ^ 1;
    }
    else {
      if (iVar4 != 0x6e) goto LAB_002d13f8;
      bVar3 = (bool)(bVar3 ^ 1);
    }
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar5 = argv[globalUtilOptind];
    if (bVar2) {
      pNew = Io_ReadBlifAsAig(pcVar5,fCheck);
    }
    else if (bVar3) {
      pNew = Io_Read(pcVar5,IO_FILE_BLIF,fCheck,0);
    }
    else {
      p = Io_ReadBlif(pcVar5,fCheck);
      if (p == (Abc_Ntk_t *)0x0) {
        return 1;
      }
      if (bVar1) {
        Abc_NtkStartNameIds(p);
      }
      pNew = Abc_NtkToLogic(p);
      if (bVar1) {
        Abc_NtkTransferNameIds(p,pNew);
      }
      Abc_NtkDelete(p);
    }
    if (pNew == (Abc_Ntk_t *)0x0) {
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNew);
    Abc_FrameClearVerifStatus(pAbc);
    return 0;
  }
LAB_002d13f8:
  fwrite("usage: read_blif [-nmach] <file>\n",0x21,1,(FILE *)pAbc->Err);
  fwrite("\t         reads the network in binary BLIF format\n",0x32,1,(FILE *)pAbc->Err);
  fwrite("\t         (if this command does not work, try \"read\")\n",0x36,1,(FILE *)pAbc->Err);
  pcVar6 = "yes";
  pcVar5 = "no";
  if (!bVar3) {
    pcVar5 = "yes";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-n     : toggle using old BLIF parser without hierarchy support [default = %s]\n",
          pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-m     : toggle saving original circuit names into a file [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar2) {
    pcVar5 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-a     : toggle creating AIG while reading the file [default = %s]\n"
          ,pcVar5);
  if (fCheck == 0) {
    pcVar6 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",pcVar6)
  ;
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandReadBlif( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fReadAsAig;
    int fCheck;
    int fUseNewParser;
    int fSaveNames;
    int c;
    extern Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck );

    fCheck = 1;
    fReadAsAig = 0;
    fUseNewParser = 1;
    fSaveNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nmach" ) ) != EOF )
    {
        switch ( c )
        {
            case 'n':
                fUseNewParser ^= 1;
                break;
            case 'm':
                fSaveNames ^= 1;
                break;
            case 'a':
                fReadAsAig ^= 1;
                break;
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    if ( fReadAsAig )
        pNtk = Io_ReadBlifAsAig( pFileName, fCheck );
    else if ( fUseNewParser )
        pNtk = Io_Read( pFileName, IO_FILE_BLIF, fCheck, 0 );
    else
    {
        Abc_Ntk_t * pTemp;
        pNtk = Io_ReadBlif( pFileName, fCheck );
        if ( pNtk == NULL )
            return 1;
        if ( fSaveNames )
            Abc_NtkStartNameIds( pNtk );
        pNtk = Abc_NtkToLogic( pTemp = pNtk );
        if ( fSaveNames )
            Abc_NtkTransferNameIds( pTemp, pNtk );
        Abc_NtkDelete( pTemp );
    }

    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_blif [-nmach] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in binary BLIF format\n" );
    fprintf( pAbc->Err, "\t         (if this command does not work, try \"read\")\n" );
    fprintf( pAbc->Err, "\t-n     : toggle using old BLIF parser without hierarchy support [default = %s]\n", !fUseNewParser? "yes":"no" );
    fprintf( pAbc->Err, "\t-m     : toggle saving original circuit names into a file [default = %s]\n", fSaveNames? "yes":"no" );
    fprintf( pAbc->Err, "\t-a     : toggle creating AIG while reading the file [default = %s]\n", fReadAsAig? "yes":"no" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}